

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::EndTestCase
          (JunitReporter *this,TestCaseInfo *param_1,Totals *param_2,string *stdOut,string *stdErr)

{
  ostream *poVar1;
  
  if (stdOut->_M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&this->m_stdOut,(string *)stdOut);
    std::operator<<(poVar1,"\n");
  }
  if (stdErr->_M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&this->m_stdErr,(string *)stdErr);
    std::operator<<(poVar1,"\n");
    return;
  }
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string& stdOut, const std::string& stdErr ) {
            if( !stdOut.empty() )
                m_stdOut << stdOut << "\n";
            if( !stdErr.empty() )
                m_stdErr << stdErr << "\n";
        }